

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write.hpp
# Opt level: O2

int ovf::detail::write::segment<float>
              (ovf_file *file,ovf_segment *segment,float *vf,bool append,int format)

{
  int *format_str;
  parser_state *ppVar1;
  bool bVar2;
  undefined7 in_register_00000009;
  undefined **args;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  allocator_type *paVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *format_str_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *format_str_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *format_str_02;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *format_str_03;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_02;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *format_str_04;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_03;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_04;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *format_str_05;
  void *__buf;
  void *__buf_00;
  long lVar5;
  int i;
  int iVar6;
  uint n_rows;
  undefined4 in_register_00000084;
  char **args_1;
  char **in_R9;
  string *output_to_file;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  allocator_type local_2ed;
  int format_local;
  float *local_2e8;
  char local_2dc [4];
  int n_cols;
  uint local_2d4;
  string local_2d0;
  string local_2b0 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_290;
  file_handle handle;
  string meshtype;
  string datatype_out;
  
  args_1 = (char **)CONCAT44(in_register_00000084,format);
  local_2dc = SUB84(CONCAT71(in_register_00000009,append),0);
  ppVar1 = file->_state;
  format_local = format;
  local_2e8 = vf;
  if ((ppVar1->file_contents).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      (ppVar1->file_contents).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start || !append) {
    std::__cxx11::string::string((string *)&handle,"",(allocator *)&local_2d0);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_assign_aux<std::__cxx11::string_const*>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)file->_state,
               &handle,&handle.field_0x20);
  }
  else {
    std::__cxx11::string::string((string *)&handle,"",(allocator *)&local_2d0);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)ppVar1,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&handle);
  }
  std::__cxx11::string::~string((string *)&handle);
  args = (undefined **)
         (file->_state->file_contents).
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
  output_to_file =
       (string *)
       ((long)&(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args)->
               _M_dataplus)._M_p +
       (((long)(file->_state->file_contents).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish - (long)args) * 0x8000000 + -0x100000000
       >> 0x1b));
  std::__cxx11::string::reserve((ulong)output_to_file);
  fmt::v5::format<std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&handle,
             (v5 *)empty_line_abi_cxx11_,format_str_00);
  std::__cxx11::string::append((string *)output_to_file);
  std::__cxx11::string::~string((string *)&handle);
  fmt::v5::format<char[18]>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&handle,
             (char (*) [18])"# Begin: Segment\n");
  std::__cxx11::string::append((string *)output_to_file);
  std::__cxx11::string::~string((string *)&handle);
  fmt::v5::format<char[17]>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&handle,
             (char (*) [17])"# Begin: Header\n");
  std::__cxx11::string::append((string *)output_to_file);
  std::__cxx11::string::~string((string *)&handle);
  fmt::v5::format<std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&handle,
             (v5 *)empty_line_abi_cxx11_,format_str_01);
  std::__cxx11::string::append((string *)output_to_file);
  std::__cxx11::string::~string((string *)&handle);
  fmt::v5::format<char[13],char*>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&handle,
             (v5 *)"# Title: {}\n",(char (*) [13])segment,args);
  std::__cxx11::string::append((string *)output_to_file);
  std::__cxx11::string::~string((string *)&handle);
  fmt::v5::format<std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&handle,
             (v5 *)empty_line_abi_cxx11_,format_str_02);
  std::__cxx11::string::append((string *)output_to_file);
  std::__cxx11::string::~string((string *)&handle);
  fmt::v5::format<char[12],char*>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&handle,
             (v5 *)"# Desc: {}\n",(char (*) [12])&segment->comment,args);
  std::__cxx11::string::append((string *)output_to_file);
  std::__cxx11::string::~string((string *)&handle);
  fmt::v5::format<std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&handle,
             (v5 *)empty_line_abi_cxx11_,format_str_03);
  std::__cxx11::string::append((string *)output_to_file);
  std::__cxx11::string::~string((string *)&handle);
  format_str = &segment->valuedim;
  fmt::v5::format<char[42],int>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&handle,
             (v5 *)"# valuedim: {}   ## field dimensionality\n",(char (*) [42])format_str,
             (int *)args);
  std::__cxx11::string::append((string *)output_to_file);
  std::__cxx11::string::~string((string *)&handle);
  std::__cxx11::string::string((string *)&handle,segment->valueunits,(allocator *)&local_2d0);
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &handle,"");
  std::__cxx11::string::~string((string *)&handle);
  if (bVar2) {
    std::__cxx11::string::append((char *)output_to_file);
    for (iVar6 = 0; iVar6 < *format_str; iVar6 = iVar6 + 1) {
      std::__cxx11::string::append((char *)output_to_file);
    }
    std::__cxx11::string::append((char *)output_to_file);
  }
  else {
    fmt::v5::format<char[18],char*>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&handle,
               (v5 *)"# valueunits: {}\n",(char (*) [18])&segment->valueunits,args);
    std::__cxx11::string::append((string *)output_to_file);
    std::__cxx11::string::~string((string *)&handle);
  }
  std::__cxx11::string::string((string *)&handle,segment->valuelabels,(allocator *)&local_2d0);
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &handle,"");
  std::__cxx11::string::~string((string *)&handle);
  if (bVar2) {
    std::__cxx11::string::append((char *)output_to_file);
    for (iVar6 = 0; iVar6 < *format_str; iVar6 = iVar6 + 1) {
      std::__cxx11::string::append((char *)output_to_file);
    }
    std::__cxx11::string::append((char *)output_to_file);
    pbVar3 = extraout_RDX_00;
  }
  else {
    fmt::v5::format<char[19],char*>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&handle,
               (v5 *)"# valuelabels: {}\n",(char (*) [19])&segment->valuelabels,args);
    std::__cxx11::string::append((string *)output_to_file);
    std::__cxx11::string::~string((string *)&handle);
    pbVar3 = extraout_RDX;
  }
  fmt::v5::format<std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&handle,
             (v5 *)empty_line_abi_cxx11_,pbVar3);
  std::__cxx11::string::append((string *)output_to_file);
  std::__cxx11::string::~string((string *)&handle);
  fmt::v5::format<char[59]>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&handle,
             (char (*) [59])"## Fundamental mesh measurement unit. Treated as a label:\n");
  std::__cxx11::string::append((string *)output_to_file);
  std::__cxx11::string::~string((string *)&handle);
  std::__cxx11::string::string((string *)&handle,segment->meshunit,(allocator *)&local_2d0);
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &handle,"");
  std::__cxx11::string::~string((string *)&handle);
  if (bVar2) {
    std::__cxx11::string::append((char *)output_to_file);
    pbVar3 = extraout_RDX_01;
  }
  else {
    fmt::v5::format<char[16],char*>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&handle,
               (v5 *)"# meshunit: {}\n",(char (*) [16])&segment->meshunit,args);
    std::__cxx11::string::append((string *)output_to_file);
    std::__cxx11::string::~string((string *)&handle);
    pbVar3 = extraout_RDX_02;
  }
  fmt::v5::format<std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&handle,
             (v5 *)empty_line_abi_cxx11_,pbVar3);
  std::__cxx11::string::append((string *)output_to_file);
  std::__cxx11::string::~string((string *)&handle);
  fmt::v5::format<char[12],float>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&handle,
             (v5 *)"# xmin: {}\n",(char (*) [12])segment->bounds_min,(float *)args);
  std::__cxx11::string::append((string *)output_to_file);
  std::__cxx11::string::~string((string *)&handle);
  fmt::v5::format<char[12],float>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&handle,
             (v5 *)"# ymin: {}\n",(char (*) [12])(segment->bounds_min + 1),(float *)args);
  std::__cxx11::string::append((string *)output_to_file);
  std::__cxx11::string::~string((string *)&handle);
  fmt::v5::format<char[12],float>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&handle,
             (v5 *)"# zmin: {}\n",(char (*) [12])(segment->bounds_min + 2),(float *)args);
  std::__cxx11::string::append((string *)output_to_file);
  std::__cxx11::string::~string((string *)&handle);
  fmt::v5::format<char[12],float>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&handle,
             (v5 *)"# xmax: {}\n",(char (*) [12])segment->bounds_max,(float *)args);
  std::__cxx11::string::append((string *)output_to_file);
  std::__cxx11::string::~string((string *)&handle);
  fmt::v5::format<char[12],float>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&handle,
             (v5 *)"# ymax: {}\n",(char (*) [12])(segment->bounds_max + 1),(float *)args);
  std::__cxx11::string::append((string *)output_to_file);
  std::__cxx11::string::~string((string *)&handle);
  fmt::v5::format<char[12],float>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&handle,
             (v5 *)"# zmax: {}\n",(char (*) [12])(segment->bounds_max + 2),(float *)args);
  std::__cxx11::string::append((string *)output_to_file);
  std::__cxx11::string::~string((string *)&handle);
  fmt::v5::format<std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&handle,
             (v5 *)empty_line_abi_cxx11_,format_str_04);
  std::__cxx11::string::append((string *)output_to_file);
  std::__cxx11::string::~string((string *)&handle);
  std::__cxx11::string::string((string *)&meshtype,segment->meshtype,(allocator *)&handle);
  bVar2 = std::operator==(&meshtype,"");
  if (bVar2) {
    std::__cxx11::string::assign((char *)&meshtype);
  }
  fmt::v5::format<char[16],std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&handle,
             (v5 *)"# meshtype: {}\n",(char (*) [16])&meshtype,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
  std::__cxx11::string::append((string *)output_to_file);
  std::__cxx11::string::~string((string *)&handle);
  bVar2 = std::operator==(&meshtype,"rectangular");
  if (bVar2) {
    fmt::v5::format<char[13],float>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&handle,
               (v5 *)"# xbase: {}\n",(char (*) [13])segment->origin,(float *)args);
    std::__cxx11::string::append((string *)output_to_file);
    std::__cxx11::string::~string((string *)&handle);
    fmt::v5::format<char[13],float>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&handle,
               (v5 *)"# ybase: {}\n",(char (*) [13])(segment->origin + 1),(float *)args);
    std::__cxx11::string::append((string *)output_to_file);
    std::__cxx11::string::~string((string *)&handle);
    fmt::v5::format<char[13],float>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&handle,
               (v5 *)"# zbase: {}\n",(char (*) [13])(segment->origin + 2),(float *)args);
    std::__cxx11::string::append((string *)output_to_file);
    std::__cxx11::string::~string((string *)&handle);
    fmt::v5::format<char[17],float>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&handle,
               (v5 *)"# xstepsize: {}\n",(char (*) [17])segment->step_size,(float *)args);
    std::__cxx11::string::append((string *)output_to_file);
    std::__cxx11::string::~string((string *)&handle);
    fmt::v5::format<char[17],float>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&handle,
               (v5 *)"# ystepsize: {}\n",(char (*) [17])(segment->step_size + 1),(float *)args);
    std::__cxx11::string::append((string *)output_to_file);
    std::__cxx11::string::~string((string *)&handle);
    fmt::v5::format<char[17],float>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&handle,
               (v5 *)"# zstepsize: {}\n",(char (*) [17])(segment->step_size + 2),(float *)args);
    std::__cxx11::string::append((string *)output_to_file);
    std::__cxx11::string::~string((string *)&handle);
    fmt::v5::format<char[14],int>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&handle,
               (v5 *)"# xnodes: {}\n",(char (*) [14])segment->n_cells,(int *)args);
    std::__cxx11::string::append((string *)output_to_file);
    std::__cxx11::string::~string((string *)&handle);
    fmt::v5::format<char[14],int>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&handle,
               (v5 *)"# ynodes: {}\n",(char (*) [14])(segment->n_cells + 1),(int *)args);
    std::__cxx11::string::append((string *)output_to_file);
    std::__cxx11::string::~string((string *)&handle);
    fmt::v5::format<char[14],int>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&handle,
               (v5 *)"# znodes: {}\n",(char (*) [14])(segment->n_cells + 2),(int *)args);
    std::__cxx11::string::append((string *)output_to_file);
    std::__cxx11::string::~string((string *)&handle);
    n_rows = segment->n_cells[1] * segment->n_cells[0] * segment->n_cells[2];
    pbVar3 = extraout_RDX_03;
LAB_0012da25:
    iVar6 = *format_str;
    n_cols = iVar6;
    local_2d4 = n_rows;
    if (0 < (int)(iVar6 * n_rows)) {
      fmt::v5::format<std::__cxx11::string>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&handle,
                 (v5 *)empty_line_abi_cxx11_,pbVar3);
      std::__cxx11::string::append((string *)output_to_file);
      std::__cxx11::string::~string((string *)&handle);
      fmt::v5::format<char[15]>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&handle,
                 (char (*) [15])"# End: Header\n");
      std::__cxx11::string::append((string *)output_to_file);
      std::__cxx11::string::~string((string *)&handle);
      fmt::v5::format<std::__cxx11::string>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&handle,
                 (v5 *)empty_line_abi_cxx11_,format_str_05);
      std::__cxx11::string::append((string *)output_to_file);
      std::__cxx11::string::~string((string *)&handle);
      if (format == 0) {
        format = 1;
        format_local = 1;
      }
      std::__cxx11::string::string((string *)&datatype_out,"",(allocator *)&handle);
      if ((uint)format < 5) {
        args = &PTR_anon_var_dwarf_9cb6d_00170d28;
        std::__cxx11::string::assign((char *)&datatype_out);
      }
      fmt::v5::format<char[18],std::__cxx11::string>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&handle,
                 (v5 *)"# Begin: Data {}\n",(char (*) [18])&datatype_out,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
      std::__cxx11::string::append((string *)output_to_file);
      std::__cxx11::string::~string((string *)&handle);
      if (format - 1U < 2) {
        pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(ulong)n_rows;
        append_data_bin_to_string<float>(output_to_file,local_2e8,iVar6,n_rows,format);
LAB_0012dc80:
        fmt::v5::format<char[16],std::__cxx11::string>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&handle,
                   (v5 *)"# End: Data {}\n",(char (*) [16])&datatype_out,pbVar3);
        std::__cxx11::string::append((string *)output_to_file);
        std::__cxx11::string::~string((string *)&handle);
        fmt::v5::format<char[16]>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&handle,
                   (char (*) [16])"# End: Segment\n");
        std::__cxx11::string::append((string *)output_to_file);
        std::__cxx11::string::~string((string *)&handle);
        if (local_2dc[0] == '\0') {
          std::__cxx11::string::string((string *)&local_2d0,file->file_name,(allocator *)&local_290)
          ;
          file_handle::file_handle(&handle,&local_2d0,false);
          std::__cxx11::string::~string((string *)&local_2d0);
          file->n_segments = 0;
          file->version = 2;
          top_header_string_abi_cxx11_();
          std::__cxx11::string::string(local_2b0,(string *)output_to_file);
          paVar4 = &local_2ed;
          __l_00._M_len = 2;
          __l_00._M_array = &local_2d0;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector(&local_290,__l_00,paVar4);
          file_handle::write(&handle,(int)&local_290,__buf_00,(size_t)paVar4);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_290);
          lVar5 = 0x20;
          do {
            std::__cxx11::string::~string((string *)((long)&local_2d0._M_dataplus._M_p + lVar5));
            lVar5 = lVar5 + -0x20;
          } while (lVar5 != -0x20);
        }
        else {
          std::__cxx11::string::string((string *)&local_2d0,file->file_name,(allocator *)&local_290)
          ;
          file_handle::file_handle(&handle,&local_2d0,true);
          std::__cxx11::string::~string((string *)&local_2d0);
          std::__cxx11::string::string((string *)&local_2d0,(string *)output_to_file);
          paVar4 = &local_2ed;
          __l._M_len = 1;
          __l._M_array = &local_2d0;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector(&local_290,__l,paVar4);
          file_handle::write(&handle,(int)&local_290,__buf,(size_t)paVar4);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_290);
          std::__cxx11::string::~string((string *)&local_2d0);
        }
        file_handle::~file_handle(&handle);
        file->found = true;
        file->is_ovf = true;
        iVar6 = increment_n_segments(file);
      }
      else {
        if (format == 3) {
          std::__cxx11::string::string((string *)&handle,"",(allocator *)&local_2d0);
          pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (ulong)n_rows;
          append_data_txt_to_string<float>(output_to_file,local_2e8,iVar6,n_rows,(string *)&handle);
LAB_0012dc73:
          std::__cxx11::string::~string((string *)&handle);
          goto LAB_0012dc80;
        }
        if (format == 4) {
          std::__cxx11::string::string((string *)&handle,",",(allocator *)&local_2d0);
          pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (ulong)n_rows;
          append_data_txt_to_string<float>(output_to_file,local_2e8,iVar6,n_rows,(string *)&handle);
          goto LAB_0012dc73;
        }
        fmt::v5::format<char[114],int>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&handle,
                   (v5 *)
                   "write_segment not writing out any data, because format \"{}\" is invalid. You may want to check what you passed in."
                   ,(char (*) [114])&format_local,(int *)args);
        std::__cxx11::string::operator=((string *)&file->_state->message_latest,(string *)&handle);
        std::__cxx11::string::~string((string *)&handle);
        iVar6 = -2;
      }
      std::__cxx11::string::~string((string *)&datatype_out);
      goto LAB_0012de86;
    }
    fmt::v5::format<char[135],int,int,char_const*>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&handle,
               (v5 *)
               "write_segment not writing out any data, because n_cols*n_rows={}*{}<=0 for file \"{}\". You may want to check the segment you passed in."
               ,(char (*) [135])&n_cols,(int *)&local_2d4,(int *)file,in_R9);
    ppVar1 = file->_state;
  }
  else {
    std::__cxx11::string::string((string *)&handle,segment->meshtype,(allocator *)&local_2d0);
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &handle,"irregular");
    std::__cxx11::string::~string((string *)&handle);
    if (bVar2) {
      fmt::v5::format<char[18],int>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&handle,
                 (v5 *)"# pointcount: {}\n",(char (*) [18])&segment->pointcount,(int *)args);
      std::__cxx11::string::append((string *)output_to_file);
      std::__cxx11::string::~string((string *)&handle);
      n_rows = segment->pointcount;
      pbVar3 = extraout_RDX_04;
      goto LAB_0012da25;
    }
    fmt::v5::format<char[137],char_const*,char*>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&handle,
               (v5 *)
               "write_segment not writing out any data to file \"{}\", because meshtype is invalid: \"{}\". You may want to check the segment you passed in."
               ,(char (*) [137])file,&segment->meshtype,args_1);
    ppVar1 = file->_state;
  }
  std::__cxx11::string::operator=((string *)&ppVar1->message_latest,(string *)&handle);
  std::__cxx11::string::~string((string *)&handle);
  iVar6 = -2;
LAB_0012de86:
  std::__cxx11::string::~string((string *)&meshtype);
  return iVar6;
}

Assistant:

int segment( ovf_file *file, const ovf_segment * segment, const T * vf,
                const bool append = false, int format = OVF_FORMAT_BIN8 )
    try
    {
        if( file->_state->file_contents.size() > 0 && append )
            file->_state->file_contents.push_back("");
        else
            file->_state->file_contents = {""};

        int index = file->_state->file_contents.size()-1;
        std::string & output_to_file = file->_state->file_contents[index];
        output_to_file.reserve( int( 0x08000000 ) );  // reserve 128[MByte]

        output_to_file += fmt::format( empty_line );
        output_to_file += fmt::format( "# Begin: Segment\n" );
        output_to_file += fmt::format( "# Begin: Header\n" );
        output_to_file += fmt::format( empty_line );

        output_to_file += fmt::format( "# Title: {}\n", segment->title );
        output_to_file += fmt::format( empty_line );

        output_to_file += fmt::format( "# Desc: {}\n", segment->comment );
        output_to_file += fmt::format( empty_line );

        // The value dimension is always 3 since we are writting Vector3-data
        output_to_file += fmt::format( "# valuedim: {}   ## field dimensionality\n", segment->valuedim );

        //
        if( std::string(segment->valueunits) == "" )
        {
            output_to_file += "# valueunits: ";
            for( int i=0; i<segment->valuedim; ++i )
                output_to_file += " unspecified";
            output_to_file += "\n";
        }
        else
            output_to_file += fmt::format( "# valueunits: {}\n", segment->valueunits );

        //
        if( std::string(segment->valuelabels) == "" )
        {
            output_to_file += "# valuelabels: ";
            for( int i=0; i<segment->valuedim; ++i )
                output_to_file += " unspecified";
            output_to_file += "\n";
        }
        else
            output_to_file += fmt::format( "# valuelabels: {}\n", segment->valuelabels );

        // spatial unit
        output_to_file += fmt::format( empty_line );
        output_to_file += fmt::format( "## Fundamental mesh measurement unit. Treated as a label:\n" );
        if( std::string(segment->meshunit) == "" )
            output_to_file += "# meshunit: unspecified\n";
        else
            output_to_file += fmt::format( "# meshunit: {}\n", segment->meshunit );

        // extent
        output_to_file += fmt::format( empty_line );
        output_to_file += fmt::format( "# xmin: {}\n", segment->bounds_min[0] );
        output_to_file += fmt::format( "# ymin: {}\n", segment->bounds_min[1] );
        output_to_file += fmt::format( "# zmin: {}\n", segment->bounds_min[2] );
        output_to_file += fmt::format( "# xmax: {}\n", segment->bounds_max[0] );
        output_to_file += fmt::format( "# ymax: {}\n", segment->bounds_max[1] );
        output_to_file += fmt::format( "# zmax: {}\n", segment->bounds_max[2] );
        output_to_file += fmt::format( empty_line );

        // Type of mesh and further keywords depending on it
        std::string meshtype = segment->meshtype;
        if( meshtype == "" )
            meshtype = "rectangular";
        output_to_file += fmt::format( "# meshtype: {}\n", meshtype );

        int n_rows = 0;
        if( meshtype == "rectangular" )
        {
            // Latice origin in space
            output_to_file += fmt::format( "# xbase: {}\n", segment->origin[0] );
            output_to_file += fmt::format( "# ybase: {}\n", segment->origin[1] );
            output_to_file += fmt::format( "# zbase: {}\n", segment->origin[2] );

            // Mesh spacing
            output_to_file += fmt::format( "# xstepsize: {}\n", segment->step_size[0] );
            output_to_file += fmt::format( "# ystepsize: {}\n", segment->step_size[1] );
            output_to_file += fmt::format( "# zstepsize: {}\n", segment->step_size[2] );

            // Number of nodes along each direction
            output_to_file += fmt::format( "# xnodes: {}\n", segment->n_cells[0] );
            output_to_file += fmt::format( "# ynodes: {}\n", segment->n_cells[1] );
            output_to_file += fmt::format( "# znodes: {}\n", segment->n_cells[2] );

            n_rows = segment->n_cells[0]*segment->n_cells[1]*segment->n_cells[2];
        }
        else if( std::string(segment->meshtype) == "irregular" )
        {
            output_to_file += fmt::format( "# pointcount: {}\n", segment->pointcount );
            n_rows = segment->pointcount;
        }
        else
        {
            file->_state->message_latest = fmt::format(
                "write_segment not writing out any data to file \"{}\", because meshtype is invalid: \"{}\". "
                "You may want to check the segment you passed in.",
                file->file_name, segment->meshtype);
            return OVF_ERROR;
        }

        int n_cols = segment->valuedim;

        // Check that we actually read in any data
        if( n_cols*n_rows <= 0 )
        {
            file->_state->message_latest = fmt::format(
                "write_segment not writing out any data, because n_cols*n_rows={}*{}<=0 for file \"{}\". "
                "You may want to check the segment you passed in.",
                n_cols, n_rows, file->file_name);
            return OVF_ERROR;
        }

        output_to_file += fmt::format( empty_line );
        output_to_file += fmt::format( "# End: Header\n" );
        output_to_file += fmt::format( empty_line );

        if( sizeof(T) == sizeof(float) && format == OVF_FORMAT_BIN )
            format = OVF_FORMAT_BIN4;
        else if( sizeof(T) == sizeof(double) && format == OVF_FORMAT_BIN )
            format = OVF_FORMAT_BIN8;

        std::string datatype_out = "";
        if ( format == OVF_FORMAT_BIN8 )
            datatype_out = "Binary 8";
        else if ( format == OVF_FORMAT_BIN4 )
            datatype_out = "Binary 4";
        else if( format == OVF_FORMAT_TEXT )
            datatype_out = "Text";
        else if( format == OVF_FORMAT_CSV )
            datatype_out = "CSV";

        // Data
        output_to_file += fmt::format( "# Begin: Data {}\n", datatype_out );

        if ( format == OVF_FORMAT_BIN || format == OVF_FORMAT_BIN8 || format == OVF_FORMAT_BIN4 )
            append_data_bin_to_string( output_to_file, vf, n_cols, n_rows, format );
        else if ( format == OVF_FORMAT_TEXT )
            append_data_txt_to_string( output_to_file, vf, n_cols, n_rows );
        else if ( format == OVF_FORMAT_CSV )
            append_data_txt_to_string( output_to_file, vf, n_cols, n_rows, "," );
        else
        {
            file->_state->message_latest = fmt::format(
                "write_segment not writing out any data, because format \"{}\" is invalid. "
                "You may want to check what you passed in.", format);
            return OVF_ERROR;
        }
        output_to_file += fmt::format( "# End: Data {}\n", datatype_out );
        output_to_file += fmt::format( "# End: Segment\n" );

        // Append the #End keywords
        if( append )
        {
            file_handle handle(file->file_name, true);
            handle.write( {output_to_file} );
        }
        else
        {
            file_handle handle(file->file_name, false);
            file->n_segments = 0;
            file->version = 2;
            handle.write( {top_header_string(), output_to_file} );
        }
        file->found  = true;
        file->is_ovf = true;

        // Increment the n_segments after succesfully appending the segment body to the file
        return increment_n_segments(file);
    }
    catch( const std::exception & ex )
    {
        file->_state->message_latest = fmt::format("Caught std::exception \"{}\"", ex.what());
        return OVF_ERROR;
    }
    catch( ... )
    {
        return OVF_ERROR;
    }